

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

void __thiscall nv::Kernel2::transpose(Kernel2 *this)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar2 = this->m_windowSize;
  if (uVar2 != 0) {
    pfVar3 = this->m_data;
    uVar6 = 0;
    uVar7 = 1;
    uVar8 = uVar2;
    uVar4 = uVar2;
    do {
      uVar4 = uVar4 - 1;
      uVar6 = uVar6 + 1;
      uVar10 = uVar7;
      uVar5 = uVar8;
      uVar9 = uVar4;
      if (uVar6 < uVar2) {
        do {
          fVar1 = pfVar3[uVar10];
          pfVar3[uVar10] = pfVar3[uVar5];
          pfVar3[uVar5] = fVar1;
          uVar9 = uVar9 - 1;
          uVar10 = uVar10 + 1;
          uVar5 = uVar5 + uVar2;
        } while (uVar9 != 0);
      }
      uVar8 = uVar8 + uVar2 + 1;
      uVar7 = uVar7 + uVar2 + 1;
    } while (uVar6 != uVar2);
  }
  return;
}

Assistant:

void Kernel2::transpose()
{
	for(uint i = 0; i < m_windowSize; i++) {
		for(uint j = i+1; j < m_windowSize; j++) {
			swap(m_data[i*m_windowSize + j], m_data[j*m_windowSize + i]);
		}
	}
}